

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void parse_assignment(LexState *ls,LHSVarList *lh,BCReg nvars)

{
  bool bVar1;
  ExpKind EVar2;
  int iVar3;
  BCReg BVar4;
  LHSVarList *pLVar5;
  FuncState *pFVar6;
  LHSVarList vl;
  
  if (3 < (lh->v).k - VLOCAL) {
    err_syntax(ls,LJ_ERR_XSYNTAX);
  }
  iVar3 = lex_opt(ls,0x2c);
  if (iVar3 == 0) {
    lex_check(ls,0x3d);
    BVar4 = expr_list(ls,&vl.v);
    if (BVar4 == nvars) {
      pFVar6 = ls->fs;
      if (vl.v.k == VCALL) {
        if ((char)pFVar6->bcbase[vl.v.u.s.info].ins == 'G') {
          pFVar6->freereg = pFVar6->freereg - 1;
          EVar2 = VRELOCABLE;
        }
        else {
          vl.v.u.s.info = vl.v.u.s.aux;
          EVar2 = VNONRELOC;
        }
        vl.v.k = EVar2;
      }
      goto LAB_00121169;
    }
    assign_adjust(ls,nvars,BVar4,&vl.v);
  }
  else {
    vl.prev = lh;
    expr_primary(ls,&vl.v);
    if (vl.v.k == VLOCAL) {
      pFVar6 = ls->fs;
      BVar4 = pFVar6->freereg;
      bVar1 = false;
      for (pLVar5 = lh; pLVar5 != (LHSVarList *)0x0; pLVar5 = pLVar5->prev) {
        if ((pLVar5->v).k == VINDEXED) {
          if ((pLVar5->v).u.s.info == vl.v.u.s.info) {
            (pLVar5->v).u.s.info = BVar4;
            bVar1 = true;
          }
          if ((pLVar5->v).u.s.aux == vl.v.u.s.info) {
            (pLVar5->v).u.s.aux = BVar4;
            bVar1 = true;
          }
        }
      }
      if (bVar1) {
        bcemit_INS(pFVar6,vl.v.u.s.info << 0x10 | BVar4 << 8 | 0x12);
        bcreg_reserve(pFVar6,1);
      }
    }
    if (199 < ls->level + nvars) {
      err_limit(ls->fs,200,"variable names");
    }
    parse_assignment(ls,&vl,nvars + 1);
  }
  pFVar6 = ls->fs;
  vl.v.u.s.info = pFVar6->freereg - 1;
  vl.v.k = VNONRELOC;
  vl.v.t = 0xffffffff;
  vl.v.f = 0xffffffff;
LAB_00121169:
  bcemit_store(pFVar6,&lh->v,&vl.v);
  return;
}

Assistant:

static void parse_assignment(LexState *ls, LHSVarList *lh, BCReg nvars)
{
  ExpDesc e;
  checkcond(ls, VLOCAL <= lh->v.k && lh->v.k <= VINDEXED, LJ_ERR_XSYNTAX);
  if (lex_opt(ls, ',')) {  /* Collect LHS list and recurse upwards. */
    LHSVarList vl;
    vl.prev = lh;
    expr_primary(ls, &vl.v);
    if (vl.v.k == VLOCAL)
      assign_hazard(ls, lh, &vl.v);
    checklimit(ls->fs, ls->level + nvars, LJ_MAX_XLEVEL, "variable names");
    parse_assignment(ls, &vl, nvars+1);
  } else {  /* Parse RHS. */
    BCReg nexps;
    lex_check(ls, '=');
    nexps = expr_list(ls, &e);
    if (nexps == nvars) {
      if (e.k == VCALL) {
	if (bc_op(*bcptr(ls->fs, &e)) == BC_VARG) {  /* Vararg assignment. */
	  ls->fs->freereg--;
	  e.k = VRELOCABLE;
	} else {  /* Multiple call results. */
	  e.u.s.info = e.u.s.aux;  /* Base of call is not relocatable. */
	  e.k = VNONRELOC;
	}
      }
      bcemit_store(ls->fs, &lh->v, &e);
      return;
    }
    assign_adjust(ls, nvars, nexps, &e);
  }
  /* Assign RHS to LHS and recurse downwards. */
  expr_init(&e, VNONRELOC, ls->fs->freereg-1);
  bcemit_store(ls->fs, &lh->v, &e);
}